

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

double recall_tree_ns::updated_entropy(recall_tree *b,uint32_t cn,example *ec)

{
  float fVar1;
  double dVar2;
  double dVar3;
  node *pnVar4;
  node_pred *pnVar5;
  node_pred *pnVar6;
  double dVar7;
  double dVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pnVar4 = (b->nodes)._begin;
  pnVar6 = pnVar4[cn].preds._begin;
  pnVar5 = pnVar4[cn].preds._end;
  if (pnVar6 != pnVar5) {
    do {
      if (pnVar6->label == (ec->l).multi.label) break;
      pnVar6 = pnVar6 + 1;
    } while (pnVar6 != pnVar5);
  }
  dVar7 = 0.0;
  dVar9 = 0.0;
  if (pnVar6 != pnVar4[cn].preds._end) {
    dVar9 = pnVar6->label_count;
  }
  fVar1 = ec->weight;
  dVar2 = pnVar4[cn].n;
  dVar10 = dVar2 + (double)fVar1;
  __x = dVar2 / dVar10;
  if ((__x != 0.0) || (NAN(__x))) {
    dVar7 = log(__x);
  }
  dVar3 = (b->nodes)._begin[cn].entropy;
  dVar12 = 0.0;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    dVar12 = log(dVar9 / dVar2);
    dVar12 = dVar12 * (dVar9 / dVar2);
  }
  dVar8 = 0.0;
  dVar11 = (double)fVar1 + dVar9;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    dVar8 = log(dVar11 / dVar10);
    dVar8 = dVar8 * (dVar11 / dVar10);
  }
  return (__x * (dVar3 + dVar12) - dVar7 * ((dVar2 - dVar9) / dVar10)) - dVar8;
}

Assistant:

double updated_entropy(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find(b, cn, ec);

  // entropy = -\sum_k (c_k/n) Log[c_k/n]
  // c_0 <- c_0 + 1, n <- n + 1
  // entropy <- + (c_0/n) Log[c_0/n]
  //            - n/(n+1) \sum_{k>0} (c_k/n) Log[c_k/n]
  //            - Log[n/(n+1)] \sum_{k>0} (c_k/(n+1))
  //            - ((c_0+1)/(n+1)) Log[(c_0+1)/(n+1)]

  double c0 = (ls == b.nodes[cn].preds.end()) ? 0 : ls->label_count;
  double deltac0 = ec.weight;
  double n = b.nodes[cn].n;

  double novernp1 = n / (deltac0 + n);
  double lognovernp1 = (novernp1 == 0) ? 0 : log(novernp1);
  double nminusc0overnp1 = (n - c0) / (n + deltac0);

  double newentropy = b.nodes[cn].entropy;

  newentropy += plogp(c0, n);
  newentropy *= novernp1;
  newentropy -= lognovernp1 * nminusc0overnp1;
  newentropy -= plogp(c0 + deltac0, n + deltac0);

  return newentropy;
}